

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O2

_Bool isVariable(char *str)

{
  variable *pvVar1;
  int iVar2;
  bool bVar3;
  variable **ppvVar4;
  
  if (str == (char *)0x0) {
    bVar3 = false;
  }
  else {
    ppvVar4 = &variables_first;
    do {
      pvVar1 = *ppvVar4;
      bVar3 = pvVar1 != (variable *)0x0;
      if (pvVar1 == (variable *)0x0) {
        return bVar3;
      }
      iVar2 = strcmp(str,pvVar1->key);
      ppvVar4 = &pvVar1->next;
    } while (iVar2 != 0);
  }
  return bVar3;
}

Assistant:

bool isVariable(const char *str)
{
    struct variable *var = variables_first;

    if (str == NULL) {
        return false;
    }

    while (var != NULL) {
        if (!strcmp(str, var->key)) {
            return true;
        }

        var = var->next;
    }

    return false;
}